

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v4.cxx
# Opt level: O0

void __thiscall
xray_re::xr_ogf_v4::partition_io::import(partition_io *this,xr_reader *r,xr_bone_vec *all_bones)

{
  __type _Var1;
  uint16_t uVar2;
  uint32_t uVar3;
  ulong __n;
  size_type sVar4;
  reference ppxVar5;
  value_type this_00;
  string *__lhs;
  bone_io *bone;
  uint_fast32_t id;
  ulong local_48;
  uint_fast32_t n;
  string name;
  xr_bone_vec *all_bones_local;
  xr_reader *r_local;
  partition_io *this_local;
  
  name.field_2._8_8_ = all_bones;
  xr_reader::r_sz(r,&(this->super_xr_partition).m_name);
  std::__cxx11::string::string((string *)&n);
  uVar2 = xr_reader::r_u16(r);
  local_48 = (ulong)uVar2;
  while( true ) {
    if (local_48 == 0) {
      std::__cxx11::string::~string((string *)&n);
      return;
    }
    xr_reader::r_sz(r,(string *)&n);
    uVar3 = xr_reader::r_u32(r);
    __n = (ulong)uVar3;
    if (0x3f < __n) break;
    sVar4 = std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::size
                      ((vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_> *)
                       name.field_2._8_8_);
    if (sVar4 <= __n) {
      std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::resize
                ((vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_> *)
                 name.field_2._8_8_,__n + 1);
    }
    ppxVar5 = std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::operator[]
                        ((vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_> *)
                         name.field_2._8_8_,__n);
    if (*ppxVar5 == (value_type)0x0) {
      this_00 = (value_type)operator_new(0x340);
      bone_io::bone_io((bone_io *)this_00);
      bone._0_2_ = (uint16_t)uVar3;
      bone_io::define((bone_io *)this_00,(uint16_t)bone,(string *)&n);
      ppxVar5 = std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::operator[]
                          ((vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_> *)
                           name.field_2._8_8_,__n);
      *ppxVar5 = this_00;
    }
    else {
      ppxVar5 = std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::at
                          ((vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_> *)
                           name.field_2._8_8_,__n);
      __lhs = xr_bone::name_abi_cxx11_(*ppxVar5);
      _Var1 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&n);
      if (!_Var1) {
        __assert_fail("all_bones.at(id)->name() == name",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                      ,0x180,
                      "void xray_re::xr_ogf_v4::partition_io::import(xr_reader &, xr_bone_vec &)");
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(this->super_xr_partition).m_bones,(value_type *)&n);
    local_48 = local_48 - 1;
  }
  __assert_fail("id < MAX_BONES",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                ,0x178,"void xray_re::xr_ogf_v4::partition_io::import(xr_reader &, xr_bone_vec &)");
}

Assistant:

inline void xr_ogf_v4::partition_io::import(xr_reader& r, xr_bone_vec& all_bones)
{
	r.r_sz(m_name);
	std::string name;
	for (uint_fast32_t n = r.r_u16(); n; --n) {
		r.r_sz(name);
		uint_fast32_t id = r.r_u32();
		xr_assert(id < MAX_BONES);
		if (all_bones.size() <= id)
			all_bones.resize(id + 1);
		if (all_bones[id] == 0) {
			xr_ogf_v4::bone_io* bone = new xr_ogf_v4::bone_io;
			bone->define(uint16_t(id), name);
			all_bones[id] = bone;
		} else {
			xr_assert(all_bones.at(id)->name() == name);
		}
		m_bones.push_back(name);
	}
}